

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::promptClear(Private *this)

{
  ulong uVar1;
  byte *pbVar2;
  usize i_1;
  long lVar3;
  usize uVar4;
  usize i;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  String clearCmd_1;
  String clearCmd;
  String local_58;
  
  lVar3 = (long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2;
  uVar6 = ((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) + lVar3;
  uVar1 = uVar6 / this->stdoutScreenWidth;
  if (uVar6 < this->stdoutScreenWidth) {
    String::String(&clearCmd,uVar6 + 0xc);
    clearCmd_1._data.ref = 0;
    clearCmd_1._data.str = "\x1b[?7l";
    clearCmd_1._data.len = 5;
    clearCmd_1.data = &clearCmd_1._data;
    String::append(&clearCmd,&clearCmd_1);
    String::~String(&clearCmd_1);
    String::append(&clearCmd,'\r');
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      String::append(&clearCmd,' ');
    }
    String::append(&clearCmd,'\r');
    clearCmd_1._data.ref = 0;
    clearCmd_1._data.str = "\x1b[?7h";
    clearCmd_1._data.len = 5;
    clearCmd_1.data = &clearCmd_1._data;
    String::append(&clearCmd,&clearCmd_1);
    String::~String(&clearCmd_1);
    pbVar2 = (byte *)String::operator_cast_to_char_(&clearCmd);
    Buffer::append(&this->bufferedOutput,pbVar2,(clearCmd.data)->len);
  }
  else {
    uVar4 = lVar3 + this->caretPos;
    moveCursorPosition(this,uVar4,-uVar4);
    String::String(&clearCmd,this->stdoutScreenWidth + 2);
    for (uVar5 = 0; uVar5 < this->stdoutScreenWidth; uVar5 = uVar5 + 1) {
      String::append(&clearCmd,' ');
    }
    clearCmd_1.data = &clearCmd_1._data;
    clearCmd_1._data.ref = 0;
    clearCmd_1._data.str = "\n\r";
    clearCmd_1._data.len = 2;
    String::append(&clearCmd,&clearCmd_1);
    String::~String(&clearCmd_1);
    String::String(&clearCmd_1,uVar6 + uVar1 * 2 + 10);
    local_58.data = &local_58._data;
    local_58._data.ref = 0;
    local_58._data.str = "\x1b[?7l";
    local_58._data.len = 5;
    String::append(&clearCmd_1,&local_58);
    String::~String(&local_58);
    for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
      String::append(&clearCmd_1,&clearCmd);
    }
    uVar4 = this->stdoutScreenWidth;
    for (uVar5 = 0; uVar5 < uVar6 - uVar4 * uVar1; uVar5 = uVar5 + 1) {
      String::append(&clearCmd_1,' ');
    }
    local_58.data = &local_58._data;
    local_58._data.ref = 0;
    local_58._data.str = "\x1b[?7h";
    local_58._data.len = 5;
    String::append(&clearCmd_1,&local_58);
    String::~String(&local_58);
    pbVar2 = (byte *)String::operator_cast_to_char_(&clearCmd_1);
    Buffer::append(&this->bufferedOutput,pbVar2,(clearCmd_1.data)->len);
    moveCursorPosition(this,((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) +
                            ((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2)
                       ,-uVar6);
    String::~String(&clearCmd_1);
  }
  String::~String(&clearCmd);
  return;
}

Assistant:

void promptClear()
  {
    usize bufferLen = prompt.size() + input.size();
    usize additionalLines = bufferLen / stdoutScreenWidth;
    if(additionalLines)
    {
      moveCursorPosition(prompt.size() + caretPos, -(ssize)(caretPos + prompt.size()));
      String clearLine(stdoutScreenWidth + 2);
      for(usize i = 0; i < stdoutScreenWidth; ++i)
        clearLine.append(' ');
      clearLine.append("\n\r");
      String clearCmd(bufferLen + additionalLines * 2
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      for(usize i = 0; i < additionalLines; ++i)
        clearCmd.append(clearLine);
      for(usize i = 0, count = bufferLen - additionalLines * stdoutScreenWidth; i < count; ++i)
        clearCmd.append(' ');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
      moveCursorPosition(prompt.size() + input.size(), -(ssize)bufferLen);
    }
    else
    {
      String clearCmd(2 + bufferLen
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      clearCmd.append('\r');
      for(usize i = 0, count = bufferLen; i < count; ++i)
        clearCmd.append(' ');
      clearCmd.append('\r');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
    }
  }